

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

void __thiscall ProString::ProString(ProString *this,char *str)

{
  char *pcVar1;
  size_t sVar2;
  storage_type *psVar3;
  int iVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  
  if (str == (char *)0x0) {
    iVar4 = 0;
    QVar6.m_data = (storage_type *)0x0;
    QVar6.m_size = (qsizetype)this;
    QString::fromLatin1(QVar6);
    this->m_offset = 0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = str + 1 + (long)psVar3;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
    QVar5.m_data = psVar3;
    QVar5.m_size = (qsizetype)this;
    QString::fromLatin1(QVar5);
    this->m_offset = 0;
    sVar2 = strlen(str);
    iVar4 = (int)sVar2;
  }
  this->m_length = iVar4;
  this->m_file = 0;
  this->m_hash = 0x80000000;
  return;
}

Assistant:

ProString::ProString(const char *str) :
    m_string(QString::fromLatin1(str)), m_offset(0), m_length(int(qstrlen(str))), m_file(0), m_hash(0x80000000)
{
}